

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O1

void __thiscall QFileDialogPrivate::deleteCurrent(QFileDialogPrivate *this)

{
  QAbstractProxyModel *pQVar1;
  QWidget *parent;
  QWidget *parent_00;
  QModelIndex *pQVar2;
  bool bVar3;
  undefined1 *puVar4;
  char cVar5;
  byte bVar6;
  uint uVar7;
  StandardButton SVar8;
  int iVar9;
  long lVar10;
  long in_FS_OFFSET;
  bool bVar11;
  QAnyStringView QVar12;
  QAnyStringView QVar13;
  QPersistentModelIndex index;
  QModelIndex local_138;
  QArrayData *local_118 [3];
  QArrayData *local_100 [3];
  QString local_e8;
  QModelIndex local_d0;
  QArrayData *local_b8;
  undefined1 *puStack_b0;
  undefined1 *local_a8;
  QArrayData *local_98;
  undefined1 *puStack_90;
  QAbstractItemModel *local_88;
  QPersistentModelIndex local_80;
  QArrayData *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  QArrayData *local_58;
  undefined1 *puStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  cVar5 = QFileSystemModel::isReadOnly();
  if (cVar5 == '\0') {
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    local_78 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    QAbstractItemView::selectionModel((QAbstractItemView *)((this->qFileDialogUi).d)->listView);
    QItemSelectionModel::selectedRows((int)&local_78);
    puVar4 = puStack_70;
    if (local_68 != (undefined1 *)0x0) {
      lVar10 = (long)local_68 * 0x18;
      do {
        local_80.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
        QPersistentModelIndex::QPersistentModelIndex
                  (&local_80,(QModelIndex *)(puVar4 + lVar10 + -0x18));
        QAbstractItemView::rootIndex
                  ((QModelIndex *)&local_58,(QAbstractItemView *)((this->qFileDialogUi).d)->listView
                  );
        cVar5 = comparesEqual(&local_80,(QModelIndex *)&local_58);
        bVar3 = false;
        if (cVar5 == '\0') {
          QPersistentModelIndex::row();
          QPersistentModelIndex::sibling((int)&local_98,(int)&local_80);
          pQVar1 = this->proxyModel;
          if (pQVar1 == (QAbstractProxyModel *)0x0) {
            local_48.ptr = local_88;
            local_58 = local_98;
            puStack_50 = puStack_90;
          }
          else {
            (**(code **)(*(long *)pQVar1 + 400))((QModelIndex *)&local_58,pQVar1,&local_98);
          }
          QPersistentModelIndex::operator=(&local_80,(QModelIndex *)&local_58);
          cVar5 = QPersistentModelIndex::isValid();
          bVar3 = false;
          if (cVar5 != '\0') {
            local_88 = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
            local_98 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
            puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
            iVar9 = (int)(QModelIndex *)&local_58;
            QPersistentModelIndex::data(iVar9);
            ::QVariant::toString();
            ::QVariant::~QVariant((QVariant *)&local_58);
            local_a8 = &DAT_aaaaaaaaaaaaaaaa;
            local_b8 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
            puStack_b0 = &DAT_aaaaaaaaaaaaaaaa;
            QPersistentModelIndex::data(iVar9);
            ::QVariant::toString();
            ::QVariant::~QVariant((QVariant *)&local_58);
            QPersistentModelIndex::parent();
            if (local_d0.m.ptr == (QAbstractItemModel *)0x0) {
              local_58 = (QArrayData *)0x0;
              puStack_50 = (undefined1 *)0x0;
              local_48.ptr = (QAbstractItemModel *)0x0;
              local_40 = 2;
            }
            else {
              (**(code **)(*(long *)local_d0.m.ptr + 0x90))
                        ((QModelIndex *)&local_58,local_d0.m.ptr,&local_d0,0x103);
            }
            bVar11 = false;
            uVar7 = ::QVariant::toInt((bool *)&local_58);
            ::QVariant::~QVariant((QVariant *)&local_58);
            parent = *(QWidget **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
            if ((uVar7 >> 9 & 1) == 0) {
              QMetaObject::tr((char *)&local_e8,(char *)&QFileDialog::staticMetaObject,0x6f4a10);
              QMetaObject::tr((char *)local_118,(char *)&QFileDialog::staticMetaObject,0x6f4c78);
              QVar12.m_size = (size_t)local_118;
              QVar12.field_0.m_data = local_100;
              QString::arg_impl(QVar12,(int)puStack_90,(QChar)(char16_t)local_88);
              SVar8 = QMessageBox::warning
                                (parent,&local_e8,(QString *)local_100,(StandardButtons)0x14000,No);
              bVar11 = SVar8 == No;
            }
            if ((uVar7 >> 9 & 1) == 0) {
              if (local_100[0] != (QArrayData *)0x0) {
                LOCK();
                (local_100[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                     (local_100[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((local_100[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(local_100[0],2,0x10);
                }
              }
              if (local_118[0] != (QArrayData *)0x0) {
                LOCK();
                (local_118[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                     (local_118[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((local_118[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(local_118[0],2,0x10);
                }
              }
              if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,0x10);
                }
              }
            }
            bVar3 = true;
            if (!bVar11) {
              parent_00 = *(QWidget **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
              QMetaObject::tr((char *)&local_58,(char *)&QFileDialog::staticMetaObject,0x6f4a10);
              QMetaObject::tr((char *)&local_138.i,(char *)&QFileDialog::staticMetaObject,0x6f4cb2);
              QVar13.m_size = (size_t)&local_138.i;
              QVar13.field_0.m_data = &local_d0;
              QString::arg_impl(QVar13,(int)puStack_90,(QChar)(char16_t)local_88);
              SVar8 = QMessageBox::warning
                                (parent_00,(QString *)&local_58,(QString *)&local_d0,
                                 (StandardButtons)0x14000,No);
              if ((QArrayData *)local_d0._0_8_ != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_d0._0_8_)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)local_d0._0_8_)->_q_value).super___atomic_base<int>._M_i +
                     -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)local_d0._0_8_)->_q_value).super___atomic_base<int>._M_i ==
                    0) {
                  QArrayData::deallocate((QArrayData *)local_d0._0_8_,2,0x10);
                }
              }
              if ((QArrayData *)local_138.i != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_138.i)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)local_138.i)->_q_value).super___atomic_base<int>._M_i + -1
                ;
                UNLOCK();
                if ((((QBasicAtomicInt *)local_138.i)->_q_value).super___atomic_base<int>._M_i == 0)
                {
                  QArrayData::deallocate((QArrayData *)local_138.i,2,0x10);
                }
              }
              if (local_58 != (QArrayData *)0x0) {
                LOCK();
                (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
                     (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(local_58,2,0x10);
                }
              }
              if ((SVar8 != No) && (cVar5 = QPersistentModelIndex::isValid(), cVar5 != '\0')) {
                pQVar2 = (QModelIndex *)this->model;
                QPersistentModelIndex::operator_cast_to_QModelIndex
                          ((QModelIndex *)&local_58,&local_80);
                cVar5 = QFileSystemModel::isDir(pQVar2);
                if (cVar5 == '\0') {
                  bVar6 = 0;
                }
                else {
                  QPersistentModelIndex::operator_cast_to_QModelIndex(&local_d0,&local_80);
                  QFileSystemModel::fileInfo(&local_138);
                  bVar6 = QFileInfo::isSymLink();
                  bVar6 = bVar6 ^ 1;
                  QFileInfo::~QFileInfo((QFileInfo *)&local_138);
                }
                if (bVar6 == 0) {
                  pQVar2 = (QModelIndex *)this->model;
                  QPersistentModelIndex::operator_cast_to_QModelIndex
                            ((QModelIndex *)&local_58,&local_80);
                  QFileSystemModel::remove(pQVar2);
                  bVar3 = false;
                }
                else {
                  local_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
                  local_58 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
                  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
                  bVar3 = false;
                  QFileSystemModel::index((QString *)&local_58,(int)this->model);
                  cVar5 = QFileSystemModel::remove((QModelIndex *)this->model);
                  if (cVar5 == '\0') {
                    QWidget::windowTitle((QString *)&local_58,parent);
                    QMetaObject::tr((char *)&local_d0,(char *)&QFileDialog::staticMetaObject,
                                    0x6f4cd8);
                    QMessageBox::warning
                              (parent,(QString *)&local_58,(QString *)&local_d0,
                               (StandardButtons)0x400,NoButton);
                    if ((QArrayData *)local_d0._0_8_ != (QArrayData *)0x0) {
                      LOCK();
                      (((QBasicAtomicInt *)local_d0._0_8_)->_q_value).super___atomic_base<int>._M_i
                           = (((QBasicAtomicInt *)local_d0._0_8_)->_q_value).
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if ((((QBasicAtomicInt *)local_d0._0_8_)->_q_value).super___atomic_base<int>.
                          _M_i == 0) {
                        QArrayData::deallocate((QArrayData *)local_d0._0_8_,2,0x10);
                      }
                    }
                    if (local_58 != (QArrayData *)0x0) {
                      LOCK();
                      (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
                           (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                        QArrayData::deallocate(local_58,2,0x10);
                      }
                    }
                  }
                }
              }
            }
            if (local_b8 != (QArrayData *)0x0) {
              LOCK();
              (local_b8->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_b8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_b8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_b8,2,0x10);
              }
            }
            if (local_98 != (QArrayData *)0x0) {
              LOCK();
              (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_98,2,0x10);
              }
            }
          }
        }
        QPersistentModelIndex::~QPersistentModelIndex(&local_80);
      } while ((!bVar3) && (lVar10 = lVar10 + -0x18, lVar10 != 0));
    }
    if (local_78 != (QArrayData *)0x0) {
      LOCK();
      (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_78,0x18,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialogPrivate::deleteCurrent()
{
    if (model->isReadOnly())
        return;

    const QModelIndexList list = qFileDialogUi->listView->selectionModel()->selectedRows();
    for (auto it = list.crbegin(), end = list.crend(); it != end; ++it) {
        QPersistentModelIndex index = *it;
        if (index == qFileDialogUi->listView->rootIndex())
            continue;

        index = mapToSource(index.sibling(index.row(), 0));
        if (!index.isValid())
            continue;

        QString fileName = index.data(QFileSystemModel::FileNameRole).toString();
        QString filePath = index.data(QFileSystemModel::FilePathRole).toString();

        QFile::Permissions p(index.parent().data(QFileSystemModel::FilePermissions).toInt());
#if QT_CONFIG(messagebox)
        Q_Q(QFileDialog);
        if (!(p & QFile::WriteUser) && (QMessageBox::warning(q_func(), QFileDialog::tr("Delete"),
                                    QFileDialog::tr("'%1' is write protected.\nDo you want to delete it anyway?")
                                    .arg(fileName),
                                     QMessageBox::Yes | QMessageBox::No, QMessageBox::No) == QMessageBox::No))
            return;
        else if (QMessageBox::warning(q_func(), QFileDialog::tr("Delete"),
                                      QFileDialog::tr("Are you sure you want to delete '%1'?")
                                      .arg(fileName),
                                      QMessageBox::Yes | QMessageBox::No, QMessageBox::No) == QMessageBox::No)
            return;

        // the event loop has run, we have to validate if the index is valid because the model might have removed it.
        if (!index.isValid())
            return;

#else
        if (!(p & QFile::WriteUser))
            return;
#endif // QT_CONFIG(messagebox)

        if (model->isDir(index) && !model->fileInfo(index).isSymLink()) {
            if (!removeDirectory(filePath)) {
#if QT_CONFIG(messagebox)
            QMessageBox::warning(q, q->windowTitle(),
                                QFileDialog::tr("Could not delete directory."));
#endif
            }
        } else {
            model->remove(index);
        }
    }
}